

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::texture::anon_unknown_0::TextureCubeShadowTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureCubeShadowTestInstance *this)

{
  size_type *psVar1;
  pointer pfVar2;
  TextureRenderer *this_00;
  ulong uVar3;
  ostringstream *poVar4;
  TestLog *log;
  pointer pFVar5;
  TestContext *pTVar6;
  bool bVar7;
  deUint32 width;
  deUint32 height;
  int iVar8;
  undefined8 *puVar9;
  TestTextureCube *pTVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar11;
  ulong uVar12;
  void *pvVar13;
  CubeFace face;
  int *piVar14;
  TextureFormat in_stack_fffffffffffffcc8;
  vector<float,_std::allocator<float>_> texCoord;
  Surface result;
  TextureFormat local_2d0;
  LodPrecision local_2c8;
  undefined4 uStack_2bc;
  ulong local_2b8 [2];
  TexComparePrecision local_2a8;
  PixelFormat pixelFormat;
  ulong local_270 [2];
  ScopedLogSection iterSection;
  undefined1 local_248 [76];
  long lStack_1fc;
  qpTestLog *local_1f4;
  undefined4 uStack_1ec;
  CompareMode CStack_1e8;
  int local_1e4;
  anon_union_16_3_1194ccdc_for_v local_1e0;
  bool local_1d0;
  undefined7 uStack_1cf;
  LodMode local_1c8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [2];
  int local_190;
  anon_union_16_3_1194ccdc_for_v local_18c [4];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  pvVar13 = (void *)((long)&local_2a8 + 0x10);
  local_2a8.coordBits.m_data._0_8_ = pvVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Test","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar3 = (long)result.m_pixels.m_ptr +
          CONCAT44(local_2a8.uvwBits.m_data[0],local_2a8.coordBits.m_data[2]);
  uVar12 = 0xf;
  if ((void *)local_2a8.coordBits.m_data._0_8_ != pvVar13) {
    uVar12 = CONCAT44(local_2a8.uvwBits.m_data[2],local_2a8.uvwBits.m_data[1]);
  }
  if (uVar12 < uVar3) {
    uVar12 = 0xf;
    if ((size_t *)CONCAT44(result.m_height,result.m_width) != &result.m_pixels.m_cap) {
      uVar12 = result.m_pixels.m_cap;
    }
    if (uVar12 < uVar3) goto LAB_0081bc92;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&result,0,(char *)0x0,local_2a8.coordBits.m_data._0_8_);
  }
  else {
LAB_0081bc92:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_2a8,(ulong)CONCAT44(result.m_height,result.m_width));
  }
  local_248._0_8_ = local_248 + 0x10;
  psVar1 = puVar9 + 2;
  if ((size_type *)*puVar9 == psVar1) {
    local_248._16_8_ = *psVar1;
    local_248._24_4_ = *(undefined4 *)(puVar9 + 3);
    local_248._28_4_ = *(undefined4 *)((long)puVar9 + 0x1c);
  }
  else {
    local_248._16_8_ = *psVar1;
    local_248._0_8_ = (size_type *)*puVar9;
  }
  local_248._8_8_ = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  pixelFormat._0_8_ = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pixelFormat,"Test ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar3 = CONCAT44(uStack_2bc,local_2c8.lodBits) + pixelFormat._8_8_;
  uVar12 = 0xf;
  if ((ulong *)pixelFormat._0_8_ != local_270) {
    uVar12 = local_270[0];
  }
  if (uVar12 < uVar3) {
    uVar12 = 0xf;
    if ((ulong *)local_2c8._0_8_ != local_2b8) {
      uVar12 = local_2b8[0];
    }
    if (uVar3 <= uVar12) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,pixelFormat._0_8_);
      goto LAB_0081bdf2;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&pixelFormat,local_2c8._0_8_);
LAB_0081bdf2:
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  pfVar2 = (pointer)(puVar9 + 2);
  if ((pointer)*puVar9 == pfVar2) {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
  }
  else {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*puVar9;
  }
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)puVar9[1];
  *puVar9 = pfVar2;
  puVar9[1] = 0;
  *(undefined1 *)pfVar2 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&iterSection,log,(string *)local_248,(string *)&texCoord);
  if ((pointer *)
      texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((ulong *)local_2c8._0_8_ != local_2b8) {
    operator_delete((void *)local_2c8._0_8_,local_2b8[0] + 1);
  }
  if ((ulong *)pixelFormat._0_8_ != local_270) {
    operator_delete((void *)pixelFormat._0_8_,local_270[0] + 1);
  }
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((size_t *)CONCAT44(result.m_height,result.m_width) != &result.m_pixels.m_cap) {
    operator_delete((undefined1 *)CONCAT44(result.m_height,result.m_width),result.m_pixels.m_cap + 1
                   );
  }
  if ((void *)local_2a8.coordBits.m_data._0_8_ != pvVar13) {
    operator_delete((void *)local_2a8.coordBits.m_data._0_8_,
                    CONCAT44(local_2a8.uvwBits.m_data[2],local_2a8.uvwBits.m_data[1]) + 1);
  }
  iVar8 = this->m_caseNdx;
  pFVar5 = (this->m_cases).
           super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->m_renderer;
  pTVar10 = util::TextureRenderer::getCubeTexture(this_00,pFVar5[iVar8].textureIndex);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_248,TEXTURETYPE_CUBE);
  util::createSampler((Sampler *)local_1b0,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      (this->m_testParameters->super_TextureCubeTestCaseParameters).
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters->super_TextureCubeTestCaseParameters).
                      super_TextureCommonTestCaseParameters.magFilter);
  pFVar5 = pFVar5 + iVar8;
  poVar4 = (ostringstream *)(local_1b0 + 8);
  local_1e4 = local_190;
  local_1f4 = local_1a0[0].m_log;
  local_248._68_8_ = local_1b0._0_8_;
  lStack_1fc = local_1b0._8_8_;
  local_1e0._0_8_ = local_18c[0]._0_8_;
  local_1e0._8_8_ = local_18c[0]._8_8_;
  uStack_1cf = (undefined7)((ulong)local_18c[1]._0_8_ >> 8);
  local_1d0 = true;
  CStack_1e8 = (this->m_testParameters->super_TextureShadowCommonTestCaseParameters).compareOp;
  uStack_1ec = local_1a0[1].m_log._0_4_;
  local_248._4_4_ = 3;
  local_1c8 = LODMODE_EXACT;
  local_248._32_4_ = pFVar5->ref;
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar4,"Compare reference value = ",0x1a);
  std::ostream::_M_insert<double>((double)(float)local_248._32_4_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Coordinates: ",0xd);
  tcu::operator<<((ostream *)poVar4,&pFVar5->bottomLeft);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," -> ",4);
  tcu::operator<<((ostream *)poVar4,&pFVar5->topRight);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_138);
  face = CUBEFACE_NEGATIVE_X;
  piVar14 = &DAT_00b58a50;
  do {
    width = util::TextureRenderer::getRenderWidth(this_00);
    height = util::TextureRenderer::getRenderHeight(this_00);
    tcu::Surface::Surface(&result,width,height);
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    glu::TextureTestUtil::computeQuadTexCoordCube
              (&texCoord,face,&pFVar5->bottomLeft,&pFVar5->topRight);
    poVar4 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Face ",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,(char *)((long)&DAT_00b58a50 + (long)*piVar14),2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
    util::TextureRenderer::renderQuad
              (this_00,&result,pFVar5->textureIndex,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(ReferenceParams *)local_248);
    ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    pixelFormat = getPixelFormat(in_stack_fffffffffffffcc8);
    local_2c8._0_8_ = (ulong *)0xa00000001;
    local_2c8.lodBits = 5;
    local_2a8.coordBits.m_data._0_8_ = (void *)0xa0000000a;
    local_2a8.coordBits.m_data[2] = 10;
    local_2a8.uvwBits.m_data[0] = 6;
    local_2a8.uvwBits.m_data[1] = 6;
    local_2a8.uvwBits.m_data[2] = 0;
    local_2a8.pcfBits = 5;
    local_2a8.referenceBits = 0x10;
    local_2a8.resultBits = pixelFormat.redBits + -1;
    pTVar6 = ((this->super_TestInstance).m_context)->m_testCtx;
    local_2d0.order = RGBA;
    local_2d0.type = UNORM_INT8;
    pvVar13 = (void *)result.m_pixels.m_cap;
    if (result.m_pixels.m_cap != 0) {
      pvVar13 = result.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b0,&local_2d0,result.m_width,result.m_height,1,pvVar13);
    iVar8 = (*(pTVar10->super_TestTexture)._vptr_TestTexture[0x10])(pTVar10);
    bVar7 = verifyTexCompareResult<tcu::TextureCube>
                      ((TestContext *)pTVar6->m_log,(ConstPixelBufferAccess *)local_1b0,
                       (TextureCube *)CONCAT44(extraout_var,iVar8),
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,(ReferenceParams *)local_248,&local_2a8,
                       &local_2c8,&pixelFormat);
    if (!bVar7) {
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),
                 "Warning: Verification assuming high-quality PCF filtering failed.",0x41);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_138);
      local_2c8.lodBits = 4;
      local_2a8.uvwBits.m_data[0] = 4;
      local_2a8.uvwBits.m_data[1] = 4;
      local_2a8.uvwBits.m_data[2] = 0;
      local_2a8.pcfBits = 0;
      pTVar6 = ((this->super_TestInstance).m_context)->m_testCtx;
      local_2d0.order = RGBA;
      local_2d0.type = UNORM_INT8;
      pvVar13 = (void *)result.m_pixels.m_cap;
      if (result.m_pixels.m_cap != 0) {
        pvVar13 = result.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1b0,&local_2d0,result.m_width,result.m_height,1,pvVar13)
      ;
      iVar8 = (*(pTVar10->super_TestTexture)._vptr_TestTexture[0x10])(pTVar10);
      bVar7 = verifyTexCompareResult<tcu::TextureCube>
                        ((TestContext *)pTVar6->m_log,(ConstPixelBufferAccess *)local_1b0,
                         (TextureCube *)CONCAT44(extraout_var_00,iVar8),
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,(ReferenceParams *)local_248,&local_2a8,
                         &local_2c8,&pixelFormat);
      if (!bVar7) {
        poVar4 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,
                   "ERROR: Verification against low precision requirements failed, failing test case."
                   ,0x51);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar4);
        std::ios_base::~ios_base(local_138);
        local_1b0._0_8_ = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"Image verification failed","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_1b0._0_8_,
                   (long)(qpTestLog **)local_1b0._0_8_ + local_1b0._8_8_);
        if ((TestLog *)local_1b0._0_8_ != local_1a0) {
          operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
        }
        if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        tcu::Surface::~Surface(&result);
        goto LAB_0081c58e;
      }
    }
    if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&result);
    face = face + CUBEFACE_POSITIVE_X;
    piVar14 = piVar14 + 1;
  } while (face != CUBEFACE_LAST);
  iVar8 = this->m_caseNdx + 1;
  this->m_caseNdx = iVar8;
  iVar11 = (int)((ulong)((long)(this->m_cases).
                               super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_cases).
                              super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (SBORROW4(iVar8,iVar11 * -0x55555555) == iVar8 + iVar11 * 0x55555555 < 0) {
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_1b0._0_8_,
               (long)(qpTestLog **)local_1b0._0_8_ + local_1b0._8_8_);
    if ((TestLog *)local_1b0._0_8_ != local_1a0) {
      operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
    }
  }
  else {
    tcu::TestStatus::incomplete();
  }
LAB_0081c58e:
  tcu::TestLog::endSection(iterSection.m_log);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TextureCubeShadowTestInstance::iterate (void)
{

	tcu::TestLog&						log				= m_context.getTestContext().getLog();
	const tcu::ScopedLogSection			iterSection		(log, string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	const FilterCase&					curCase			= m_cases[m_caseNdx];
	const pipeline::TestTextureCube&	texture			= m_renderer.getCubeTexture(curCase.textureIndex);

	ReferenceParams						sampleParams	(TEXTURETYPE_CUBE);

	// Params for reference computation.
	sampleParams.sampler					= util::createSampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, m_testParameters.minFilter, m_testParameters.magFilter);
	sampleParams.sampler.seamlessCubeMap	= true;
	sampleParams.sampler.compare			= m_testParameters.compareOp;
	sampleParams.samplerType				= SAMPLERTYPE_SHADOW;
	sampleParams.lodMode					= LODMODE_EXACT;
	sampleParams.ref						= curCase.ref;

	log	<< TestLog::Message
		<< "Compare reference value = " << sampleParams.ref << "\n"
		<< "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight
		<< TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			result		(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
		vector<float>			texCoord;

		computeQuadTexCoordCube(texCoord, face, curCase.bottomLeft, curCase.topRight);

		log << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		// \todo Log texture coordinates.

		m_renderer.renderQuad(result, curCase.textureIndex, &texCoord[0], sampleParams);

		{
			const tcu::PixelFormat		pixelFormat			= getPixelFormat(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
			tcu::LodPrecision			lodPrecision		(tcu::LodPrecision::RULE_VULKAN);
			tcu::TexComparePrecision	texComparePrecision;

			lodPrecision.derivateBits			= 10;
			lodPrecision.lodBits				= 5;
			texComparePrecision.coordBits		= tcu::IVec3(10,10,10);
			texComparePrecision.uvwBits			= tcu::IVec3(6,6,0);
			texComparePrecision.pcfBits			= 5;
			texComparePrecision.referenceBits	= 16;
			texComparePrecision.resultBits		= pixelFormat.redBits-1;

			const bool isHighQuality = verifyTexCompareResult(m_context.getTestContext(), result.getAccess(), texture.getTexture(),
															  &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				log << TestLog::Message << "Warning: Verification assuming high-quality PCF filtering failed." << TestLog::EndMessage;

				lodPrecision.lodBits			= 4;
				texComparePrecision.uvwBits		= tcu::IVec3(4,4,0);
				texComparePrecision.pcfBits		= 0;

				const bool isOk = verifyTexCompareResult(m_context.getTestContext(), result.getAccess(), texture.getTexture(),
														 &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

				if (!isOk)
				{
					log << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					return tcu::TestStatus::fail("Image verification failed");
				}
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? tcu::TestStatus::incomplete() : tcu::TestStatus::pass("Pass");
}